

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::AssignInst::deep_copy(AssignInst *this)

{
  Value *val;
  Value *in_RDI;
  Value *in_stack_ffffffffffffffe0;
  VarId *in_stack_ffffffffffffffe8;
  AssignInst *in_stack_fffffffffffffff0;
  
  val = (Value *)operator_new(0x38);
  VarId::VarId((VarId *)in_RDI,(VarId *)val);
  Value::Value(in_RDI,val);
  AssignInst(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return (Inst *)val;
}

Assistant:

Inst* deep_copy() { return new AssignInst(dest, src); }